

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  AABBNodeMB4D *node1;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  uint uVar40;
  uint uVar41;
  uint uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_143c;
  RTCIntersectArguments *local_1438;
  long local_1430;
  ulong local_1428;
  Geometry *local_1420;
  long local_1418;
  long local_1410;
  ulong local_1408;
  ulong *local_1400;
  RayQueryContext *local_13f8;
  Scene *local_13f0;
  undefined4 local_13e8;
  undefined4 local_13e4;
  undefined4 local_13e0;
  undefined4 local_13dc;
  undefined4 local_13d8;
  undefined4 local_13d4;
  uint local_13d0;
  uint local_13cc;
  uint local_13c8;
  RTCFilterFunctionNArguments local_13b8;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  byte local_1347;
  float local_1338 [4];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    if (0.0 <= ray->tfar) {
      local_1400 = local_11d8 + 1;
      aVar2 = (ray->dir).field_0.field_1;
      auVar19 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar16._8_4_ = 0x7fffffff;
      auVar16._0_8_ = 0x7fffffff7fffffff;
      auVar16._12_4_ = 0x7fffffff;
      auVar16 = vandps_avx512vl((undefined1  [16])aVar2,auVar16);
      auVar29._8_4_ = 0x219392ef;
      auVar29._0_8_ = 0x219392ef219392ef;
      auVar29._12_4_ = 0x219392ef;
      uVar12 = vcmpps_avx512vl(auVar16,auVar29,1);
      bVar3 = (bool)((byte)uVar12 & 1);
      auVar17._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.x;
      bVar3 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar17._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.y;
      bVar3 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar17._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.z;
      bVar3 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar17._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * aVar2.field_3.a;
      auVar16 = vrcp14ps_avx512vl(auVar17);
      auVar18._8_4_ = 0x3f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._12_4_ = 0x3f800000;
      auVar18 = vfnmadd213ps_avx512vl(auVar17,auVar16,auVar18);
      auVar17 = vfmadd132ps_fma(auVar18,auVar16,auVar16);
      auVar30 = vbroadcastss_avx512vl(auVar17);
      auVar44 = ZEXT3264(auVar30);
      auVar16 = vmovshdup_avx(auVar17);
      auVar30 = vbroadcastsd_avx512vl(auVar16);
      auVar45 = ZEXT3264(auVar30);
      auVar18 = vshufpd_avx(auVar17,auVar17,1);
      auVar31._8_4_ = 2;
      auVar31._0_8_ = 0x200000002;
      auVar31._12_4_ = 2;
      auVar31._16_4_ = 2;
      auVar31._20_4_ = 2;
      auVar31._24_4_ = 2;
      auVar31._28_4_ = 2;
      auVar30 = vpermps_avx512vl(auVar31,ZEXT1632(auVar17));
      auVar46 = ZEXT3264(auVar30);
      fVar35 = auVar17._0_4_ * (ray->org).field_0.m128[0];
      auVar33._4_4_ = fVar35;
      auVar33._0_4_ = fVar35;
      auVar33._8_4_ = fVar35;
      auVar33._12_4_ = fVar35;
      auVar33._16_4_ = fVar35;
      auVar33._20_4_ = fVar35;
      auVar33._24_4_ = fVar35;
      auVar33._28_4_ = fVar35;
      auVar30._8_4_ = 1;
      auVar30._0_8_ = 0x100000001;
      auVar30._12_4_ = 1;
      auVar30._16_4_ = 1;
      auVar30._20_4_ = 1;
      auVar30._24_4_ = 1;
      auVar30._28_4_ = 1;
      auVar34 = ZEXT1632(CONCAT412(auVar17._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar17._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar17._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar35))));
      auVar30 = vpermps_avx2(auVar30,auVar34);
      auVar34 = vpermps_avx2(auVar31,auVar34);
      local_1408 = (ulong)(auVar17._0_4_ < 0.0) << 5;
      uVar13 = (ulong)(auVar16._0_4_ < 0.0) << 5 | 0x40;
      uVar12 = (ulong)(auVar18._0_4_ < 0.0) << 5 | 0x80;
      uVar14 = local_1408 ^ 0x20;
      auVar31 = vbroadcastss_avx512vl(auVar19);
      auVar47 = ZEXT3264(auVar31);
      auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      auVar48 = ZEXT3264(auVar31);
      auVar32._8_4_ = 0x80000000;
      auVar32._0_8_ = 0x8000000080000000;
      auVar32._12_4_ = 0x80000000;
      auVar32._16_4_ = 0x80000000;
      auVar32._20_4_ = 0x80000000;
      auVar32._24_4_ = 0x80000000;
      auVar32._28_4_ = 0x80000000;
      auVar31 = vxorps_avx512vl(auVar33,auVar32);
      auVar49 = ZEXT3264(auVar31);
      auVar30 = vxorps_avx512vl(auVar30,auVar32);
      auVar50 = ZEXT3264(auVar30);
      auVar30 = vxorps_avx512vl(auVar34,auVar32);
      auVar51 = ZEXT3264(auVar30);
      auVar19 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar52 = ZEXT1664(auVar19);
      auVar19 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
      auVar53 = ZEXT1664(auVar19);
      auVar19 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
      auVar54 = ZEXT1664(auVar19);
      auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar55 = ZEXT1664(auVar19);
      local_13f8 = context;
LAB_01c60709:
      if (local_1400 != local_11d8) {
        uVar15 = local_1400[-1];
        local_1400 = local_1400 + -1;
        do {
          uVar1 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
          auVar34._4_4_ = uVar1;
          auVar34._0_4_ = uVar1;
          auVar34._8_4_ = uVar1;
          auVar34._12_4_ = uVar1;
          auVar34._16_4_ = uVar1;
          auVar34._20_4_ = uVar1;
          auVar34._24_4_ = uVar1;
          auVar34._28_4_ = uVar1;
          do {
            if ((uVar15 & 8) != 0) {
              local_1410 = (ulong)((uint)uVar15 & 0xf) - 8;
              uVar15 = uVar15 & 0xfffffffffffffff0;
              local_1418 = 0;
              goto LAB_01c60889;
            }
            uVar8 = uVar15 & 0xfffffffffffffff0;
            auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + local_1408),auVar34,
                                      *(undefined1 (*) [32])(uVar8 + 0x40 + local_1408));
            auVar30 = vfmadd213ps_avx512vl(ZEXT1632(auVar19),auVar44._0_32_,auVar49._0_32_);
            auVar31 = vmaxps_avx512vl(auVar47._0_32_,auVar30);
            auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + uVar13),auVar34,
                                      *(undefined1 (*) [32])(uVar8 + 0x40 + uVar13));
            auVar16 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + uVar12),auVar34,
                                      *(undefined1 (*) [32])(uVar8 + 0x40 + uVar12));
            auVar30 = vfmadd213ps_avx512vl(ZEXT1632(auVar19),auVar45._0_32_,auVar50._0_32_);
            auVar32 = vfmadd213ps_avx512vl(ZEXT1632(auVar16),auVar46._0_32_,auVar51._0_32_);
            auVar30 = vmaxps_avx(auVar30,auVar32);
            auVar30 = vmaxps_avx(auVar31,auVar30);
            auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + uVar14),auVar34,
                                      *(undefined1 (*) [32])(uVar8 + 0x40 + uVar14));
            auVar31 = vfmadd213ps_avx512vl(ZEXT1632(auVar19),auVar44._0_32_,auVar49._0_32_);
            auVar32 = vminps_avx512vl(auVar48._0_32_,auVar31);
            auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + (uVar13 ^ 0x20)),
                                      auVar34,*(undefined1 (*) [32])(uVar8 + 0x40 + (uVar13 ^ 0x20))
                                     );
            auVar16 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar8 + 0x100 + (uVar12 ^ 0x20)),
                                      auVar34,*(undefined1 (*) [32])(uVar8 + 0x40 + (uVar12 ^ 0x20))
                                     );
            auVar31 = vfmadd213ps_avx512vl(ZEXT1632(auVar19),auVar45._0_32_,auVar50._0_32_);
            auVar33 = vfmadd213ps_avx512vl(ZEXT1632(auVar16),auVar46._0_32_,auVar51._0_32_);
            auVar31 = vminps_avx(auVar31,auVar33);
            auVar31 = vminps_avx(auVar32,auVar31);
            if (((uint)uVar15 & 7) == 6) {
              uVar5 = vcmpps_avx512vl(auVar30,auVar31,2);
              uVar6 = vcmpps_avx512vl(auVar34,*(undefined1 (*) [32])(uVar8 + 0x1c0),0xd);
              uVar7 = vcmpps_avx512vl(auVar34,*(undefined1 (*) [32])(uVar8 + 0x1e0),1);
              uVar9 = (uint)uVar5 & (uint)uVar6 & (uint)uVar7;
            }
            else {
              uVar5 = vcmpps_avx512vl(auVar30,auVar31,2);
              uVar9 = (uint)uVar5;
            }
            if ((byte)uVar9 == 0) goto LAB_01c60709;
            lVar11 = 0;
            for (uVar15 = (ulong)(byte)uVar9; (uVar15 & 1) == 0;
                uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar11 = lVar11 + 1;
            }
            uVar15 = *(ulong *)(uVar8 + lVar11 * 8);
            uVar9 = (uVar9 & 0xff) - 1 & uVar9 & 0xff;
            uVar10 = (ulong)uVar9;
          } while (uVar9 == 0);
          do {
            *local_1400 = uVar15;
            local_1400 = local_1400 + 1;
            lVar11 = 0;
            for (uVar15 = uVar10; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar11 = lVar11 + 1;
            }
            uVar10 = uVar10 - 1 & uVar10;
            uVar15 = *(ulong *)(uVar8 + lVar11 * 8);
          } while (uVar10 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_01c60889:
  if (local_1418 == local_1410) goto LAB_01c60709;
  lVar11 = local_1418 * 0x140;
  uVar1 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x90 + lVar11),auVar28,
                            *(undefined1 (*) [16])(uVar15 + lVar11));
  auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xa0 + lVar11),auVar28,
                            *(undefined1 (*) [16])(uVar15 + 0x10 + lVar11));
  auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xb0 + lVar11),auVar28,
                            *(undefined1 (*) [16])(uVar15 + 0x20 + lVar11));
  auVar19 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xc0 + lVar11),auVar28,
                            *(undefined1 (*) [16])(uVar15 + 0x30 + lVar11));
  auVar16 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xd0 + lVar11),auVar28,
                            *(undefined1 (*) [16])(uVar15 + 0x40 + lVar11));
  auVar18 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xe0 + lVar11),auVar28,
                            *(undefined1 (*) [16])(uVar15 + 0x50 + lVar11));
  auVar17 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xf0 + lVar11),auVar28,
                            *(undefined1 (*) [16])(uVar15 + 0x60 + lVar11));
  auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x100 + lVar11),auVar28,
                            *(undefined1 (*) [16])(uVar15 + 0x70 + lVar11));
  auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x110 + lVar11),auVar28,
                            *(undefined1 (*) [16])(uVar15 + 0x80 + lVar11));
  auVar19 = vsubps_avx(auVar23,auVar19);
  auVar16 = vsubps_avx(auVar24,auVar16);
  auVar18 = vsubps_avx(auVar25,auVar18);
  auVar17 = vsubps_avx(auVar17,auVar23);
  auVar29 = vsubps_avx(auVar29,auVar24);
  auVar28 = vsubps_avx(auVar28,auVar25);
  auVar20._0_4_ = auVar16._0_4_ * auVar28._0_4_;
  auVar20._4_4_ = auVar16._4_4_ * auVar28._4_4_;
  auVar20._8_4_ = auVar16._8_4_ * auVar28._8_4_;
  auVar20._12_4_ = auVar16._12_4_ * auVar28._12_4_;
  local_1308 = vfmsub231ps_fma(auVar20,auVar29,auVar18);
  auVar21._0_4_ = auVar18._0_4_ * auVar17._0_4_;
  auVar21._4_4_ = auVar18._4_4_ * auVar17._4_4_;
  auVar21._8_4_ = auVar18._8_4_ * auVar17._8_4_;
  auVar21._12_4_ = auVar18._12_4_ * auVar17._12_4_;
  local_12f8 = vfmsub231ps_fma(auVar21,auVar28,auVar19);
  auVar26._0_4_ = auVar19._0_4_ * auVar29._0_4_;
  auVar26._4_4_ = auVar19._4_4_ * auVar29._4_4_;
  auVar26._8_4_ = auVar19._8_4_ * auVar29._8_4_;
  auVar26._12_4_ = auVar19._12_4_ * auVar29._12_4_;
  uVar1 = *(undefined4 *)&(ray->dir).field_0;
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar20 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar21 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[2]));
  uVar1 = *(undefined4 *)&(ray->org).field_0;
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar22 = vsubps_avx512vl(auVar23,auVar22);
  local_12e8 = vfmsub231ps_fma(auVar26,auVar17,auVar16);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23 = vsubps_avx512vl(auVar24,auVar23);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24 = vsubps_avx512vl(auVar25,auVar24);
  auVar25 = vmulps_avx512vl(auVar20,auVar24);
  auVar25 = vfmsub231ps_avx512vl(auVar25,auVar23,auVar21);
  auVar26 = vmulps_avx512vl(auVar21,auVar22);
  auVar26 = vfmsub231ps_avx512vl(auVar26,auVar24,auVar43);
  auVar27 = vmulps_avx512vl(auVar43,auVar23);
  auVar27 = vfmsub231ps_avx512vl(auVar27,auVar22,auVar20);
  auVar21 = vmulps_avx512vl(local_12e8,auVar21);
  auVar20 = vfmadd231ps_avx512vl(auVar21,local_12f8,auVar20);
  auVar20 = vfmadd231ps_avx512vl(auVar20,local_1308,auVar43);
  local_1358 = vandps_avx512vl(auVar20,auVar52._0_16_);
  auVar28 = vmulps_avx512vl(auVar28,auVar27);
  auVar29 = vfmadd231ps_avx512vl(auVar28,auVar26,auVar29);
  auVar17 = vfmadd231ps_fma(auVar29,auVar25,auVar17);
  auVar29 = vandps_avx512vl(auVar20,auVar53._0_16_);
  uVar9 = auVar29._0_4_;
  local_1388._0_4_ = (float)(uVar9 ^ auVar17._0_4_);
  uVar40 = auVar29._4_4_;
  local_1388._4_4_ = (float)(uVar40 ^ auVar17._4_4_);
  uVar41 = auVar29._8_4_;
  local_1388._8_4_ = (float)(uVar41 ^ auVar17._8_4_);
  uVar42 = auVar29._12_4_;
  local_1388._12_4_ = (float)(uVar42 ^ auVar17._12_4_);
  auVar18 = vmulps_avx512vl(auVar18,auVar27);
  auVar16 = vfmadd231ps_avx512vl(auVar18,auVar16,auVar26);
  auVar19 = vfmadd231ps_fma(auVar16,auVar19,auVar25);
  local_1378._0_4_ = (float)(uVar9 ^ auVar19._0_4_);
  local_1378._4_4_ = (float)(uVar40 ^ auVar19._4_4_);
  local_1378._8_4_ = (float)(uVar41 ^ auVar19._8_4_);
  local_1378._12_4_ = (float)(uVar42 ^ auVar19._12_4_);
  auVar19 = auVar54._0_16_;
  uVar5 = vcmpps_avx512vl(local_1388,auVar19,5);
  uVar6 = vcmpps_avx512vl(local_1378,auVar19,5);
  uVar7 = vcmpps_avx512vl(auVar20,auVar19,4);
  auVar19._0_4_ = local_1388._0_4_ + local_1378._0_4_;
  auVar19._4_4_ = local_1388._4_4_ + local_1378._4_4_;
  auVar19._8_4_ = local_1388._8_4_ + local_1378._8_4_;
  auVar19._12_4_ = local_1388._12_4_ + local_1378._12_4_;
  uVar4 = vcmpps_avx512vl(auVar19,local_1358,2);
  local_1347 = (byte)uVar5 & (byte)uVar6 & (byte)uVar7 & (byte)uVar4;
  if (local_1347 != 0) {
    auVar39._0_4_ = auVar24._0_4_ * local_12e8._0_4_;
    auVar39._4_4_ = auVar24._4_4_ * local_12e8._4_4_;
    auVar39._8_4_ = auVar24._8_4_ * local_12e8._8_4_;
    auVar39._12_4_ = auVar24._12_4_ * local_12e8._12_4_;
    auVar19 = vfmadd213ps_fma(auVar23,local_12f8,auVar39);
    auVar19 = vfmadd213ps_fma(auVar22,local_1308,auVar19);
    local_1368._0_4_ = (float)(uVar9 ^ auVar19._0_4_);
    local_1368._4_4_ = (float)(uVar40 ^ auVar19._4_4_);
    local_1368._8_4_ = (float)(uVar41 ^ auVar19._8_4_);
    local_1368._12_4_ = (float)(uVar42 ^ auVar19._12_4_);
    uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar25._4_4_ = uVar1;
    auVar25._0_4_ = uVar1;
    auVar25._8_4_ = uVar1;
    auVar25._12_4_ = uVar1;
    auVar19 = vmulps_avx512vl(local_1358,auVar25);
    fVar35 = ray->tfar;
    auVar27._4_4_ = fVar35;
    auVar27._0_4_ = fVar35;
    auVar27._8_4_ = fVar35;
    auVar27._12_4_ = fVar35;
    auVar16 = vmulps_avx512vl(local_1358,auVar27);
    uVar5 = vcmpps_avx512vl(local_1368,auVar16,2);
    uVar6 = vcmpps_avx512vl(auVar19,local_1368,1);
    local_1347 = (byte)uVar5 & (byte)uVar6 & local_1347;
    if (local_1347 != 0) {
      local_13f0 = local_13f8->scene;
      auVar19 = vrcp14ps_avx512vl(local_1358);
      auVar16 = vfnmadd213ps_avx512vl(local_1358,auVar19,auVar55._0_16_);
      auVar19 = vfmadd132ps_fma(auVar16,auVar19,auVar19);
      fVar35 = auVar19._0_4_;
      fVar36 = auVar19._4_4_;
      fVar37 = auVar19._8_4_;
      fVar38 = auVar19._12_4_;
      local_1318[0] = fVar35 * local_1368._0_4_;
      local_1318[1] = fVar36 * local_1368._4_4_;
      local_1318[2] = fVar37 * local_1368._8_4_;
      local_1318[3] = fVar38 * local_1368._12_4_;
      local_1338[0] = fVar35 * local_1388._0_4_;
      local_1338[1] = fVar36 * local_1388._4_4_;
      local_1338[2] = fVar37 * local_1388._8_4_;
      local_1338[3] = fVar38 * local_1388._12_4_;
      local_1328._0_4_ = fVar35 * local_1378._0_4_;
      local_1328._4_4_ = fVar36 * local_1378._4_4_;
      local_1328._8_4_ = fVar37 * local_1378._8_4_;
      local_1328._12_4_ = fVar38 * local_1378._12_4_;
      local_1428 = (ulong)local_1347;
      local_1430 = lVar11 + uVar15;
      do {
        auVar19 = auVar54._0_16_;
        uVar8 = 0;
        for (uVar10 = local_1428; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
          uVar8 = uVar8 + 1;
        }
        local_13d0 = *(uint *)(local_1430 + 0x120 + uVar8 * 4);
        local_1420 = (local_13f0->geometries).items[local_13d0].ptr;
        if ((local_1420->mask & ray->mask) == 0) {
          local_1428 = local_1428 ^ 1L << (uVar8 & 0x3f);
        }
        else {
          if ((local_13f8->args->filter == (RTCFilterFunctionN)0x0) &&
             (local_1420->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01c60dee:
            ray->tfar = -INFINITY;
            return;
          }
          local_1438 = local_13f8->args;
          local_12d8 = auVar51._0_32_;
          local_12b8 = auVar50._0_32_;
          local_1298 = auVar49._0_32_;
          local_1278 = auVar48._0_32_;
          local_1258 = auVar47._0_32_;
          local_1238 = auVar46._0_32_;
          local_1218 = auVar45._0_32_;
          local_11f8 = auVar44._0_32_;
          uVar10 = (ulong)(uint)((int)uVar8 * 4);
          local_13b8.context = local_13f8->user;
          local_13e8 = *(undefined4 *)(local_1308 + uVar10);
          local_13e4 = *(undefined4 *)(local_12f8 + uVar10);
          local_13e0 = *(undefined4 *)(local_12e8 + uVar10);
          local_13dc = *(undefined4 *)((long)local_1338 + uVar10);
          local_13d8 = *(undefined4 *)(local_1328 + uVar10);
          local_13d4 = *(undefined4 *)(local_1430 + 0x130 + uVar10);
          local_13cc = (local_13b8.context)->instID[0];
          local_13c8 = (local_13b8.context)->instPrimID[0];
          fVar35 = ray->tfar;
          ray->tfar = *(float *)((long)local_1318 + uVar10);
          local_143c = -1;
          local_13b8.valid = &local_143c;
          local_13b8.geometryUserPtr = local_1420->userPtr;
          local_13b8.hit = (RTCHitN *)&local_13e8;
          local_13b8.N = 1;
          local_13b8.ray = (RTCRayN *)ray;
          if (((local_1420->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
              ((*local_1420->occlusionFilterN)(&local_13b8), *local_13b8.valid != 0)) &&
             ((local_1438->filter == (RTCFilterFunctionN)0x0 ||
              ((((local_1438->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT && (((local_1420->field_8).field_0x2 & 0x40) == 0))
               || ((*local_1438->filter)(&local_13b8), *local_13b8.valid != 0))))))
          goto LAB_01c60dee;
          ray->tfar = fVar35;
          local_1428 = local_1428 ^ 1L << (uVar8 & 0x3f);
          auVar44 = ZEXT3264(local_11f8);
          auVar45 = ZEXT3264(local_1218);
          auVar46 = ZEXT3264(local_1238);
          auVar47 = ZEXT3264(local_1258);
          auVar48 = ZEXT3264(local_1278);
          auVar49 = ZEXT3264(local_1298);
          auVar50 = ZEXT3264(local_12b8);
          auVar51 = ZEXT3264(local_12d8);
          auVar16 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar52 = ZEXT1664(auVar16);
          auVar16 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
          auVar53 = ZEXT1664(auVar16);
          auVar19 = vxorps_avx512vl(auVar19,auVar19);
          auVar54 = ZEXT1664(auVar19);
          auVar19 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar55 = ZEXT1664(auVar19);
        }
      } while (local_1428 != 0);
    }
  }
  local_1418 = local_1418 + 1;
  goto LAB_01c60889;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }